

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ImplicitTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitTypeSyntax,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1,Token *args_2)

{
  Token signing;
  Token placeholder;
  ImplicitTypeSyntax *this_00;
  
  this_00 = (ImplicitTypeSyntax *)allocate(this,0x70,8);
  signing.kind = args->kind;
  signing._2_1_ = args->field_0x2;
  signing.numFlags.raw = (args->numFlags).raw;
  signing.rawLen = args->rawLen;
  signing.info = args->info;
  placeholder.kind = args_2->kind;
  placeholder._2_1_ = args_2->field_0x2;
  placeholder.numFlags.raw = (args_2->numFlags).raw;
  placeholder.rawLen = args_2->rawLen;
  placeholder.info = args_2->info;
  slang::syntax::ImplicitTypeSyntax::ImplicitTypeSyntax(this_00,signing,args_1,placeholder);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }